

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SGIX_instruments(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SGIX_instruments != 0) {
    glad_glGetInstrumentsSGIX = (PFNGLGETINSTRUMENTSSGIXPROC)(*load)("glGetInstrumentsSGIX");
    glad_glInstrumentsBufferSGIX =
         (PFNGLINSTRUMENTSBUFFERSGIXPROC)(*load)("glInstrumentsBufferSGIX");
    glad_glPollInstrumentsSGIX = (PFNGLPOLLINSTRUMENTSSGIXPROC)(*load)("glPollInstrumentsSGIX");
    glad_glReadInstrumentsSGIX = (PFNGLREADINSTRUMENTSSGIXPROC)(*load)("glReadInstrumentsSGIX");
    glad_glStartInstrumentsSGIX = (PFNGLSTARTINSTRUMENTSSGIXPROC)(*load)("glStartInstrumentsSGIX");
    glad_glStopInstrumentsSGIX = (PFNGLSTOPINSTRUMENTSSGIXPROC)(*load)("glStopInstrumentsSGIX");
  }
  return;
}

Assistant:

static void load_GL_SGIX_instruments(GLADloadproc load) {
	if(!GLAD_GL_SGIX_instruments) return;
	glad_glGetInstrumentsSGIX = (PFNGLGETINSTRUMENTSSGIXPROC)load("glGetInstrumentsSGIX");
	glad_glInstrumentsBufferSGIX = (PFNGLINSTRUMENTSBUFFERSGIXPROC)load("glInstrumentsBufferSGIX");
	glad_glPollInstrumentsSGIX = (PFNGLPOLLINSTRUMENTSSGIXPROC)load("glPollInstrumentsSGIX");
	glad_glReadInstrumentsSGIX = (PFNGLREADINSTRUMENTSSGIXPROC)load("glReadInstrumentsSGIX");
	glad_glStartInstrumentsSGIX = (PFNGLSTARTINSTRUMENTSSGIXPROC)load("glStartInstrumentsSGIX");
	glad_glStopInstrumentsSGIX = (PFNGLSTOPINSTRUMENTSSGIXPROC)load("glStopInstrumentsSGIX");
}